

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void monty_export_into(MontyContext *mc,mp_int *r,mp_int *x)

{
  ulong uVar1;
  mp_int mVar2;
  
  if (x->nw <= mc->rw * 2) {
    mVar2 = monty_reduce_internal(mc,x,*mc->scratch);
    uVar1 = mVar2.nw;
    if (r->nw < mVar2.nw) {
      uVar1 = r->nw;
    }
    memmove(r->w,mVar2.w,uVar1 * 8);
    smemclr(r->w + uVar1,(r->nw - uVar1) * 8);
    smemclr(mc->scratch->w,mc->scratch->nw << 3);
    return;
  }
  __assert_fail("x->nw <= 2*mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x601,"void monty_export_into(MontyContext *, mp_int *, mp_int *)");
}

Assistant:

void monty_export_into(MontyContext *mc, mp_int *r, mp_int *x)
{
    assert(x->nw <= 2*mc->rw);
    mp_int reduced = monty_reduce_internal(mc, x, *mc->scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}